

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checker.cc
# Opt level: O3

bool __thiscall xLearn::Checker::check_prediction_param(Checker *this,HyperParam *hyper_param)

{
  pointer pcVar1;
  bool bVar2;
  bool bVar3;
  ostream *poVar4;
  Checker *this_00;
  Modifier reset;
  Modifier bold;
  Modifier red;
  Modifier local_4c;
  Modifier local_48;
  Modifier local_44;
  string local_40;
  
  if (hyper_param->from_file == true) {
    bVar3 = FileExist((hyper_param->test_set_file)._M_dataplus._M_p);
    bVar2 = true;
    if (bVar3) goto LAB_00150e8d;
    StringPrintf_abi_cxx11_
              (&local_40,"Test set file: %s does not exist.",
               (hyper_param->test_set_file)._M_dataplus._M_p);
    local_48.code = BOLD;
    local_4c.code = RESET;
    local_44.code = FG_RED;
    poVar4 = Color::operator<<((ostream *)&std::cout,&local_44);
    poVar4 = Color::operator<<(poVar4,&local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"[ ERROR      ] ",0xf);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,local_40._M_dataplus._M_p,local_40._M_string_length);
    poVar4 = Color::operator<<(poVar4,&local_4c);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
  }
  else {
    bVar2 = true;
    if (hyper_param->test_dataset != (DMatrix *)0x0) goto LAB_00150e8d;
    StringPrintf_abi_cxx11_(&local_40,"Test dataset is None, please check!");
    local_48.code = BOLD;
    local_4c.code = RESET;
    local_44.code = FG_RED;
    poVar4 = Color::operator<<((ostream *)&std::cout,&local_44);
    poVar4 = Color::operator<<(poVar4,&local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"[ ERROR      ] ",0xf);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,local_40._M_dataplus._M_p,local_40._M_string_length);
    poVar4 = Color::operator<<(poVar4,&local_4c);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  bVar2 = false;
LAB_00150e8d:
  this_00 = (Checker *)(hyper_param->model_file)._M_dataplus._M_p;
  bVar3 = FileExist((char *)this_00);
  if (bVar3) {
    if (-1 < hyper_param->thread_number) {
      if (!bVar2) {
        return false;
      }
      check_conflict_predict(this_00,hyper_param);
      if (hyper_param->res_out != true) {
        return true;
      }
      if ((hyper_param->output_file)._M_string_length != 0) {
        return true;
      }
      pcVar1 = (hyper_param->test_set_file)._M_dataplus._M_p;
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_40,pcVar1,pcVar1 + (hyper_param->test_set_file)._M_string_length);
      std::__cxx11::string::append((char *)&local_40);
      std::__cxx11::string::operator=((string *)&hyper_param->output_file,(string *)&local_40);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p);
        return true;
      }
      return true;
    }
  }
  else {
    StringPrintf_abi_cxx11_
              (&local_40,"Model file: %s does not exist.",(hyper_param->model_file)._M_dataplus._M_p
              );
    local_48.code = BOLD;
    local_4c.code = RESET;
    local_44.code = FG_RED;
    poVar4 = Color::operator<<((ostream *)&std::cout,&local_44);
    poVar4 = Color::operator<<(poVar4,&local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"[ ERROR      ] ",0xf);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,local_40._M_dataplus._M_p,local_40._M_string_length);
    poVar4 = Color::operator<<(poVar4,&local_4c);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
    if (-1 < hyper_param->thread_number) {
      return false;
    }
  }
  StringPrintf_abi_cxx11_(&local_40,"The thread number must be greater than zero: %d.");
  local_48.code = BOLD;
  local_4c.code = RESET;
  local_44.code = FG_RED;
  poVar4 = Color::operator<<((ostream *)&std::cout,&local_44);
  poVar4 = Color::operator<<(poVar4,&local_48);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"[ ERROR      ] ",0xf);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_40._M_dataplus._M_p,local_40._M_string_length);
  poVar4 = Color::operator<<(poVar4,&local_4c);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return false;
}

Assistant:

bool Checker::check_prediction_param(HyperParam& hyper_param) {
 bool bo = true;
 /*********************************************************
  *  Check the path of test set file                      *
  *********************************************************/
 if (hyper_param.from_file) {
  if (!FileExist(hyper_param.test_set_file.c_str())) {
      Color::print_error(
        StringPrintf("Test set file: %s does not exist.",
            hyper_param.test_set_file.c_str())
      );
      bo =  false;
  }
 } else {
   if (hyper_param.test_dataset == nullptr) {
      Color::print_error(
        StringPrintf("Test dataset is None, please check!")
      );
      bo =  false;
   }
 }
 /*********************************************************
  *  Check the path of model file                         *
  *********************************************************/
 if (!FileExist(hyper_param.model_file.c_str())) {
    Color::print_error(
      StringPrintf("Model file: %s does not exist.",
           hyper_param.model_file.c_str())
    );
    bo = false;
 }
 /*********************************************************
  *  Check invalid value                                  *
  *********************************************************/
 if (hyper_param.thread_number < 0) {
    Color::print_error(
      StringPrintf("The thread number must be greater than zero: %d.",
        hyper_param.thread_number)
    );
    bo = false;
  }
 if (!bo) return false;
 /*********************************************************
  *  Check warning and fix conflict                       *
  *********************************************************/
 check_conflict_predict(hyper_param);
 /*********************************************************
  *  Set default value                                    *
  *********************************************************/
 if (hyper_param.res_out) {
  if (hyper_param.output_file.empty()) {
    hyper_param.output_file = hyper_param.test_set_file + ".out";
  }
 }

 return true;
}